

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O0

bool __thiscall HttpHeaderBase::addField(HttpHeaderBase *this,FieldType type,char *data)

{
  bool bVar1;
  char *data_local;
  FieldType type_local;
  HttpHeaderBase *this_local;
  
  bVar1 = this->mNumFields < 0x20;
  if (bVar1) {
    this->mFields[this->mNumFields].mType = type;
    HeaderField::setData(this->mFields + this->mNumFields,data);
    this->mNumFields = this->mNumFields + 1;
    std::__cxx11::string::clear();
  }
  return bVar1;
}

Assistant:

bool HttpHeaderBase::addField(FieldMap::FieldType type, const char *data)
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (mNumFields >= kMaxFields)
		return false;
	
	mFields[mNumFields].mType = type;
	mFields[mNumFields].setData(data);
	mNumFields++;

	// Make sure we re-build the header if it has already been built.
	mHeaderStr.clear();
	
	return true;
}